

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall t_html_generator::~t_html_generator(t_html_generator *this)

{
  t_html_generator *this_local;
  
  ~t_html_generator(this);
  operator_delete(this);
  return;
}

Assistant:

t_html_generator(t_program* program,
                   const std::map<std::string, std::string>& parsed_options,
                   const std::string& option_string)
    : t_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    standalone_ = false;
    unsafe_ = false;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("standalone") == 0) {
        standalone_ = true;
      } else if( iter->first.compare("noescape") == 0) {
        unsafe_ = true;
      } else {
        throw "unknown option html:" + iter->first;
      }
    }


    out_dir_base_ = "gen-html";
    input_type_ = INPUT_UNKNOWN;

    escape_.clear();
    escape_['&'] = "&amp;";
    escape_['<'] = "&lt;";
    escape_['>'] = "&gt;";
    escape_['"'] = "&quot;";
    escape_['\''] = "&apos;";

    init_allowed__markup();
  }